

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O0

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::handle_cli_req_callback_async
          (raft_server *this,ptr<cmd_result<ptr<buffer>_>_> *async_res)

{
  element_type *this_00;
  element_type *__addr_len;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  element_type *in_RDI;
  ptr<cmd_result<ptr<buffer>_>_> pVar1;
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
  *in_stack_ffffffffffffffc8;
  element_type *this_01;
  
  __addr_len = in_RDI;
  this_01 = in_RDI;
  this_00 = std::
            __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x258ef2);
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::accept
            (this_00,in_ESI,__addr,(socklen_t *)__addr_len);
  std::
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
  ::shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                *)this_01,in_stack_ffffffffffffffc8);
  pVar1.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  pVar1.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar1.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > >
    raft_server::handle_cli_req_callback_async(ptr< cmd_result< ptr<buffer> > > async_res)
{
    async_res->accept();
    return async_res;
}